

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncRgbLedAnalyzer.cpp
# Opt level: O3

void __thiscall AsyncRgbLedAnalyzer::SynchronizeToReset(AsyncRgbLedAnalyzer *this)

{
  double dVar1;
  double dVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  undefined1 auVar6 [16];
  TimingTolerance local_38;
  
  iVar3 = AnalyzerChannelData::GetBitState();
  if (iVar3 == 1) {
    AnalyzerChannelData::AdvanceToNextEdge();
  }
  while( true ) {
    lVar4 = AnalyzerChannelData::GetSampleNumber();
    lVar5 = AnalyzerChannelData::GetSampleOfNextEdge();
    lVar5 = lVar5 - lVar4;
    auVar6._8_4_ = (int)((ulong)lVar5 >> 0x20);
    auVar6._0_8_ = lVar5;
    auVar6._12_4_ = 0x45300000;
    dVar1 = this->mSampleRateHz;
    AsyncRgbLedAnalyzerSettings::ResetTiming
              (&local_38,
               (this->mSettings)._M_t.
               super___uniq_ptr_impl<AsyncRgbLedAnalyzerSettings,_std::default_delete<AsyncRgbLedAnalyzerSettings>_>
               ._M_t.
               super__Tuple_impl<0UL,_AsyncRgbLedAnalyzerSettings_*,_std::default_delete<AsyncRgbLedAnalyzerSettings>_>
               .super__Head_base<0UL,_AsyncRgbLedAnalyzerSettings_*,_false>._M_head_impl);
    dVar2 = local_38.mMinimumSec;
    AnalyzerChannelData::AdvanceToAbsPosition((ulonglong)this->mChannelData);
    if (dVar2 < ((auVar6._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0)) / dVar1) break;
    AnalyzerChannelData::AdvanceToNextEdge();
  }
  return;
}

Assistant:

void AsyncRgbLedAnalyzer::SynchronizeToReset()
{
    if( mChannelData->GetBitState() == BIT_HIGH )
    {
        mChannelData->AdvanceToNextEdge();
    }

    for( ;; )
    {
        const U64 lowTransition = mChannelData->GetSampleNumber();
        const U64 highTransition = mChannelData->GetSampleOfNextEdge();
        double lowTimeSec = ( highTransition - lowTransition ) / mSampleRateHz;

        if( lowTimeSec > mSettings->ResetTiming().mMinimumSec )
        {
            // it's a reset, we are done
            // advance to the end of the reset, ready for the first
            // ReadRGB / ReadBit
            mChannelData->AdvanceToAbsPosition( highTransition );
            return;
        }

        // advance past the rising edge, to the next falling edge,
        // which is our next candidate for the beginning of a RESET
        mChannelData->AdvanceToAbsPosition( highTransition );
        mChannelData->AdvanceToNextEdge();
    }
}